

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_hello_select_negotiated_group
              (ptls_key_exchange_algorithm_t **selected,ptls_key_exchange_algorithm_t **candidates,
              uint8_t *src,uint8_t *end)

{
  int iVar1;
  long *local_58;
  ptls_key_exchange_algorithm_t **c;
  uint8_t *puStack_48;
  uint16_t id;
  uint8_t *end_1;
  size_t _block_size;
  size_t _capacity;
  uint8_t *puStack_28;
  int ret;
  uint8_t *end_local;
  uint8_t *src_local;
  ptls_key_exchange_algorithm_t **candidates_local;
  ptls_key_exchange_algorithm_t **selected_local;
  
  _block_size = 2;
  if ((ulong)((long)end - (long)src) < 2) {
    _capacity._4_4_ = 0x32;
  }
  else {
    end_1 = (uint8_t *)0x0;
    end_local = src;
    do {
      puStack_48 = end_local + 1;
      end_1 = (uint8_t *)((long)end_1 << 8 | (ulong)*end_local);
      _block_size = _block_size - 1;
      end_local = puStack_48;
    } while (_block_size != 0);
    if (end + -(long)puStack_48 < end_1) {
      _capacity._4_4_ = 0x32;
    }
    else {
      puStack_48 = puStack_48 + (long)end_1;
      _block_size = 0;
      puStack_28 = end;
      src_local = (uint8_t *)candidates;
      candidates_local = selected;
      do {
        iVar1 = decode16((uint16_t *)((long)&c + 6),&end_local,puStack_48);
        if (iVar1 != 0) {
          return iVar1;
        }
        if (*candidates_local == (ptls_key_exchange_algorithm_t *)0x0) {
          for (local_58 = (long *)src_local; *local_58 != 0; local_58 = local_58 + 1) {
            if (*(short *)*local_58 == c._6_2_) {
              *candidates_local = (ptls_key_exchange_algorithm_t *)*local_58;
              break;
            }
          }
        }
        _capacity._4_4_ = 0;
      } while (end_local != puStack_48);
      if (end_local == puStack_48) {
        if (end_local == puStack_28) {
          _capacity._4_4_ = 0x28;
          if (*candidates_local != (ptls_key_exchange_algorithm_t *)0x0) {
            _capacity._4_4_ = 0;
          }
        }
        else {
          _capacity._4_4_ = 0x32;
        }
      }
      else {
        _capacity._4_4_ = 0x32;
      }
    }
  }
  return _capacity._4_4_;
}

Assistant:

static int client_hello_select_negotiated_group(ptls_key_exchange_algorithm_t **selected,
                                                ptls_key_exchange_algorithm_t **candidates, const uint8_t *src, const uint8_t *end)
{
    int ret;

    decode_block(src, end, 2, {
        do {
            uint16_t id;
            if ((ret = decode16(&id, &src, end)) != 0)
                goto Exit;
            if (*selected == NULL) {
                ptls_key_exchange_algorithm_t **c = candidates;
                for (; *c != NULL; ++c) {
                    if ((*c)->id == id) {
                        *selected = *c;
                        break;
                    }
                }
            }
        } while (src != end);
    });
    ret = *selected != NULL ? 0 : PTLS_ALERT_HANDSHAKE_FAILURE;

Exit:
    return ret;
}